

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O3

void __thiscall brown::Tile::drawhlin(Tile *this,int x0,int x1,int y,uint32_t col)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  
  auVar3 = _DAT_001081a0;
  auVar2 = _DAT_00108190;
  auVar1 = _DAT_00108180;
  if ((uint)y < (uint)this->y) {
    uVar4 = 0;
    if (0 < x0) {
      uVar4 = x0;
    }
    if (this->x < x1) {
      x1 = this->x;
    }
    if ((int)uVar4 < x1) {
      lVar5 = (ulong)(uint)x1 - (ulong)uVar4;
      lVar6 = lVar5 + -1;
      auVar8._8_4_ = (int)lVar6;
      auVar8._0_8_ = lVar6;
      auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = (long)y * (long)this->p + this->f + (ulong)uVar4 * 4;
      uVar7 = 0;
      auVar8 = auVar8 ^ _DAT_001081a0;
      do {
        auVar10._8_4_ = (int)uVar7;
        auVar10._0_8_ = uVar7;
        auVar10._12_4_ = (int)(uVar7 >> 0x20);
        auVar11 = (auVar10 | auVar2) ^ auVar3;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_
                    ) & 1)) {
          *(uint32_t *)(lVar6 + uVar7 * 4) = col;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          *(uint32_t *)(lVar6 + 4 + uVar7 * 4) = col;
        }
        auVar10 = (auVar10 | auVar1) ^ auVar3;
        iVar12 = auVar10._4_4_;
        if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
          *(uint32_t *)(lVar6 + 8 + uVar7 * 4) = col;
          *(uint32_t *)(lVar6 + 0xc + uVar7 * 4) = col;
        }
        uVar7 = uVar7 + 4;
      } while ((lVar5 + 3U & 0xfffffffffffffffc) != uVar7);
    }
  }
  return;
}

Assistant:

void Tile::drawhlin (int x0, int x1, int y, std::uint32_t col)
{
    int x;
    std::uint32_t *lptr;

    if ((unsigned)y >= (unsigned)this->y) return;
    x0 = max(x0,0); x1 = min(x1,this->x); if (x0 >= x1) return;
    lptr = (std::uint32_t *)(this->p*y + this->f);
    for(x=x0;x<x1;x++) lptr[x] = col;
}